

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QDnsServiceRecord>::begin(QList<QDnsServiceRecord> *this)

{
  QDnsServiceRecord *n;
  QArrayDataPointer<QDnsServiceRecord> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QDnsServiceRecord> *)0x3518a9);
  QArrayDataPointer<QDnsServiceRecord>::operator->(in_RDI);
  n = QArrayDataPointer<QDnsServiceRecord>::begin((QArrayDataPointer<QDnsServiceRecord> *)0x3518ba);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }